

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementCableANCF::EvaluateSectionFrame
          (ChElementCableANCF *this,double eta,ChVector<double> *point,ChQuaternion<double> *rot)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pointer psVar13;
  element_type *peVar14;
  element_type *peVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  char cVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ChVector<double> Dx;
  ChVector<double> mZ;
  ChVector<double> mY;
  ChVector<double> mX;
  ShapeVector N;
  ChVector<double> local_130;
  double local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  double local_f0;
  ulong local_e8;
  ChVector<double> local_e0;
  ChVector<double> local_c0;
  ChVector<double> local_a0;
  ulong local_80;
  double local_78;
  ulong local_70;
  ulong local_68;
  
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1b]
  )(this,&local_80);
  psVar13 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar14 = (psVar13->super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  peVar15 = psVar13[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_100 = *(ulong *)&(peVar14->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_100;
  uVar1 = *(ulong *)&(peVar14->super_ChNodeFEAxyz).field_0x28;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar1;
  uVar2 = *(ulong *)&(peVar14->super_ChNodeFEAxyz).field_0x30;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar2;
  local_118 = *(double *)&(peVar14->super_ChNodeFEAxyz).field_0xf0;
  local_f0 = *(double *)&peVar14->field_0xf8;
  dVar23 = *(double *)&peVar14->field_0x100;
  local_108 = *(ulong *)&(peVar15->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_108;
  local_e8 = *(ulong *)&(peVar15->super_ChNodeFEAxyz).field_0x28;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_e8;
  uVar3 = *(ulong *)&(peVar15->super_ChNodeFEAxyz).field_0x30;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar3;
  local_110 = *(ulong *)&(peVar15->super_ChNodeFEAxyz).field_0xf0;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_110;
  local_f8 = *(ulong *)&peVar15->field_0xf8;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_f8;
  uVar4 = *(ulong *)&peVar15->field_0x100;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar4;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_80;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_118 * local_78;
  auVar16 = vfmadd231sd_fma(auVar36,auVar25,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_70;
  auVar16 = vfmadd231sd_fma(auVar16,auVar40,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_68;
  auVar16 = vfmadd231sd_fma(auVar16,auVar44,auVar53);
  point->m_data[0] = auVar16._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_f0 * local_78;
  auVar16 = vfmadd231sd_fma(auVar37,auVar25,auVar50);
  auVar16 = vfmadd231sd_fma(auVar16,auVar40,auVar51);
  auVar16 = vfmadd231sd_fma(auVar16,auVar44,auVar52);
  point->m_data[1] = auVar16._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar23 * local_78;
  auVar16 = vfmadd231sd_fma(auVar33,auVar46,auVar25);
  auVar16 = vfmadd231sd_fma(auVar16,auVar48,auVar40);
  auVar16 = vfmadd231sd_fma(auVar16,auVar49,auVar44);
  point->m_data[2] = auVar16._0_8_;
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x1c]
  )(this,&local_80);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_80;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_100;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_78 * local_118;
  auVar16 = vfmadd231sd_fma(auVar38,auVar26,auVar16);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_70;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_108;
  auVar16 = vfmadd231sd_fma(auVar16,auVar41,auVar5);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_68;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_110;
  auVar16 = vfmadd231sd_fma(auVar16,auVar45,auVar6);
  local_130.m_data[0] = auVar16._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar1;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_78 * local_f0;
  auVar5 = vfmadd231sd_fma(auVar47,auVar26,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_e8;
  auVar5 = vfmadd231sd_fma(auVar5,auVar41,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_f8;
  auVar5 = vfmadd231sd_fma(auVar5,auVar45,auVar9);
  local_130.m_data[1] = auVar5._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_78 * dVar23;
  auVar5 = vfmadd231sd_fma(auVar34,auVar26,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar3;
  auVar5 = vfmadd231sd_fma(auVar5,auVar41,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar4;
  auVar5 = vfmadd231sd_fma(auVar5,auVar45,auVar12);
  local_130.m_data[2] = auVar5._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_130.m_data[1] * local_130.m_data[1];
  auVar16 = vfmadd231sd_fma(auVar27,auVar16,auVar16);
  auVar16 = vfmadd231sd_fma(auVar16,auVar5,auVar5);
  if (auVar16._0_8_ < 0.0) {
    dVar23 = sqrt(auVar16._0_8_);
  }
  else {
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    dVar23 = auVar16._0_8_;
  }
  if (dVar23 < 2.2250738585072014e-308) {
    local_130.m_data[0] = 1.0;
    local_130.m_data[1] = 0.0;
    local_130.m_data[2] = 0.0;
  }
  else {
    dVar23 = 1.0 / dVar23;
    local_130.m_data[0] = dVar23 * local_130.m_data[0];
    local_130.m_data[1] = dVar23 * local_130.m_data[1];
    local_130.m_data[2] = dVar23 * local_130.m_data[2];
  }
  local_a0.m_data[2] = 0.0;
  local_a0.m_data[0] = 0.0;
  local_a0.m_data[1] = 0.0;
  local_c0.m_data[2] = 0.0;
  local_c0.m_data[0] = 0.0;
  local_c0.m_data[1] = 0.0;
  local_e0.m_data[2] = 0.0;
  local_e0.m_data[0] = 0.0;
  local_e0.m_data[1] = 0.0;
  ChVector<double>::DirToDxDyDz
            (&local_130,&local_a0,&local_c0,&local_e0,(ChVector<double> *)&VECT_Y);
  dVar21 = local_a0.m_data[2];
  dVar20 = local_a0.m_data[1];
  dVar19 = local_c0.m_data[2];
  dVar18 = local_c0.m_data[0];
  dVar17 = local_e0.m_data[1];
  dVar42 = local_e0.m_data[0];
  dVar23 = local_a0.m_data[0] + local_c0.m_data[1] + local_e0.m_data[2];
  if (0.0 <= dVar23) {
    dVar23 = dVar23 + 1.0;
    if (dVar23 < 0.0) {
      dVar23 = sqrt(dVar23);
    }
    else {
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar23;
      auVar16 = vsqrtsd_avx(auVar28,auVar28);
      dVar23 = auVar16._0_8_;
    }
    dVar24 = dVar23 * 0.5;
    dVar23 = 0.5 / dVar23;
    dVar32 = (dVar19 - dVar17) * dVar23;
    dVar35 = (dVar42 - dVar21) * dVar23;
    dVar23 = (dVar20 - dVar18) * dVar23;
  }
  else {
    cVar22 = local_a0.m_data[0] < local_c0.m_data[1];
    dVar23 = local_a0.m_data[0];
    if ((bool)cVar22) {
      dVar23 = local_c0.m_data[1];
    }
    if (dVar23 < local_e0.m_data[2]) {
      cVar22 = '\x02';
    }
    if (cVar22 == '\x02') {
      dVar23 = ((local_e0.m_data[2] - local_a0.m_data[0]) - local_c0.m_data[1]) + 1.0;
      if (dVar23 < 0.0) {
        dVar24 = sqrt(dVar23);
      }
      else {
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar23;
        auVar16 = vsqrtsd_avx(auVar30,auVar30);
        dVar24 = auVar16._0_8_;
      }
      dVar23 = dVar24 * 0.5;
      dVar24 = 0.5 / dVar24;
      dVar32 = (dVar21 + dVar42) * dVar24;
      dVar35 = (dVar17 + dVar19) * dVar24;
      dVar42 = dVar20 - dVar18;
    }
    else if (cVar22 == '\x01') {
      dVar23 = ((local_c0.m_data[1] - local_e0.m_data[2]) - local_a0.m_data[0]) + 1.0;
      if (dVar23 < 0.0) {
        dVar24 = sqrt(dVar23);
      }
      else {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar23;
        auVar16 = vsqrtsd_avx(auVar29,auVar29);
        dVar24 = auVar16._0_8_;
      }
      dVar35 = dVar24 * 0.5;
      dVar24 = 0.5 / dVar24;
      dVar23 = (dVar17 + dVar19) * dVar24;
      dVar32 = (dVar18 + dVar20) * dVar24;
      dVar42 = dVar42 - dVar21;
    }
    else {
      dVar23 = ((local_a0.m_data[0] - local_c0.m_data[1]) - local_e0.m_data[2]) + 1.0;
      if (dVar23 < 0.0) {
        dVar24 = sqrt(dVar23);
      }
      else {
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar23;
        auVar16 = vsqrtsd_avx(auVar31,auVar31);
        dVar24 = auVar16._0_8_;
      }
      dVar32 = dVar24 * 0.5;
      dVar24 = 0.5 / dVar24;
      dVar35 = (dVar18 + dVar20) * dVar24;
      dVar23 = (dVar21 + dVar42) * dVar24;
      dVar42 = dVar19 - dVar17;
    }
    dVar24 = dVar42 * dVar24;
  }
  rot->m_data[0] = dVar24;
  rot->m_data[1] = dVar32;
  rot->m_data[2] = dVar35;
  rot->m_data[3] = dVar23;
  return;
}

Assistant:

void ChElementCableANCF::EvaluateSectionFrame(const double eta, ChVector<>& point, ChQuaternion<>& rot) {
    ChVector<> u_displ;
    ChVector<> u_rotaz;

    double xi = (eta + 1.0) * 0.5;  // because ShapeFunctions() works in 0..1 range
    ShapeVector N;
    ShapeFunctions(N, xi);

    ChVector<> pA = this->nodes[0]->GetPos();
    ChVector<> dA = this->nodes[0]->GetD();
    ChVector<> pB = this->nodes[1]->GetPos();
    ChVector<> dB = this->nodes[1]->GetD();

    point.x() = N(0) * pA.x() + N(1) * dA.x() + N(2) * pB.x() + N(3) * dB.x();
    point.y() = N(0) * pA.y() + N(1) * dA.y() + N(2) * pB.y() + N(3) * dB.y();
    point.z() = N(0) * pA.z() + N(1) * dA.z() + N(2) * pB.z() + N(3) * dB.z();

    this->ShapeFunctionsDerivatives(N, xi);

    ChVector<> Dx;

    Dx.x() = N(0) * pA.x() + N(1) * dA.x() + N(2) * pB.x() + N(3) * dB.x();
    Dx.y() = N(0) * pA.y() + N(1) * dA.y() + N(2) * pB.y() + N(3) * dB.y();
    Dx.z() = N(0) * pA.z() + N(1) * dA.z() + N(2) * pB.z() + N(3) * dB.z();

    // This element has no torsional dof, so once we have the Dx direction
    // of the line, we must compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization , where we propose a guess direction
    // VECT_Y for the vertical:
    ChMatrix33<> msect;
    Dx.Normalize();
    msect.Set_A_Xdir(Dx, VECT_Y);

    rot = msect.Get_A_quaternion();
}